

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valsrc_state.c
# Opt level: O0

int mpt_valsrc_state(mpt_valsrc *src,char *data)

{
  byte bVar1;
  ushort **ppuVar2;
  int local_28;
  uint8_t local_21;
  int curr;
  uint8_t state;
  char *data_local;
  mpt_valsrc *src_local;
  
  if ((data == (char *)0x0) || (*data == '\0')) {
    src->state = '\x02';
    src_local._4_4_ = 0;
  }
  else {
    ppuVar2 = __ctype_b_loc();
    if (((*ppuVar2)[(int)*data] & 0x400) == 0) {
      src->state = '\x02';
      src_local._4_4_ = 0;
    }
    else {
      ppuVar2 = __ctype_b_loc();
      if (((*ppuVar2)[(int)data[1]] & 0x400) == 0) {
        switch(*data) {
        case 'A':
          local_21 = '\0';
          break;
        default:
          src->state = '\x02';
          return 0;
        case 'F':
          local_21 = '\x03';
          break;
        case 'I':
          local_21 = '\x06';
          break;
        case 'S':
          local_21 = '\x05';
          break;
        case 'a':
          local_21 = '\a';
          break;
        case 'f':
          local_21 = '\x04';
          break;
        case 'i':
          local_21 = '\x01';
          break;
        case 's':
          local_21 = '\x02';
        }
        src->state = local_21;
        local_28 = 1;
        _curr = data + 1;
        while( true ) {
          bVar1 = _curr[1];
          if (bVar1 == 0) break;
          ppuVar2 = __ctype_b_loc();
          if (((*ppuVar2)[(int)(uint)bVar1] & 0x2000) == 0) {
            return local_28;
          }
          local_28 = local_28 + 1;
          _curr = _curr + 1;
        }
        src_local._4_4_ = local_28;
      }
      else {
        src_local._4_4_ = -2;
      }
    }
  }
  return src_local._4_4_;
}

Assistant:

extern int mpt_valsrc_state(MPT_STRUCT(valsrc) *src, const char *data)
{
	uint8_t state;
	int curr;
	
	/* special validity for binding */
	if (!data || !*data) {
		src->state = MPT_DATASTATE(Step);
		return 0;
	}
	if (!isalpha(*data)) {
		src->state = MPT_DATASTATE(Step);
		return 0;
	}
	if (isalpha(data[1])) {
		return MPT_ERROR(BadValue);
	}
	switch (*data++) {
		case 'i': state = MPT_DATASTATE(Init); break;
		case 'I': state = MPT_DATASTATE(All) & ~MPT_DATASTATE(Init); break;
		case 's': state = MPT_DATASTATE(Step); break;
		case 'S': state = MPT_DATASTATE(All) & ~MPT_DATASTATE(Step); break;
		case 'f': state = MPT_DATASTATE(Fini); break;
		case 'F': state = MPT_DATASTATE(All) & ~MPT_DATASTATE(Fini); break;
		case 'A': state = 0; break;
		case 'a': state = MPT_DATASTATE(All); break;
		default:
			src->state = MPT_DATASTATE(Step);
			return 0;
	}
	src->state = state;
	curr = 1;
	while ((state = *(++data))) {
		if (!isspace(state)) {
			return curr;
		}
		++curr;
	}
	return curr;
}